

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

int __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::remove
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  int iVar1;
  uint uVar2;
  Item *pIVar3;
  DataKey *pDVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  pIVar3 = this->theitem;
  pDVar4 = this->thekey;
  uVar5 = 0xffffffff;
  uVar6 = 0;
  iVar7 = 0;
  while( true ) {
    iVar1 = this->thenum;
    if ((long)iVar1 <= (long)uVar6) break;
    if (*(int *)(__filename + uVar6 * 4) < 0) {
      uVar2 = pDVar4[uVar6].idx;
      pIVar3[(int)uVar2].info = this->firstfree;
      this->firstfree = ~uVar2;
      if ((int)uVar5 < 0) {
        uVar5 = uVar6 & 0xffffffff;
      }
    }
    else {
      *(int *)(__filename + uVar6 * 4) = iVar7;
      iVar7 = iVar7 + 1;
    }
    uVar6 = uVar6 + 1;
  }
  if (-1 < (int)uVar5) {
    for (; (int)uVar5 < iVar1; uVar5 = uVar5 + 1) {
      if ((long)*(int *)(__filename + uVar5 * 4) < 0) {
        this->thenum = this->thenum + -1;
      }
      else {
        pDVar4[*(int *)(__filename + uVar5 * 4)] = pDVar4[uVar5];
        pDVar4 = this->thekey;
        this->theitem[pDVar4[uVar5].idx].info = *(int *)(__filename + uVar5 * 4);
        pDVar4[uVar5].idx = -1;
      }
    }
  }
  return (int)pDVar4;
}

Assistant:

void remove(int perm[])
   {
      int k, j, first = -1;

      // setup permutation and remove items
      for(k = j = 0; k < num(); ++k)
      {
         if(perm[k] >= 0)       // j has not been removed ...
            perm[k] = j++;
         else
         {
            int idx = thekey[k].idx;
            theitem[idx].info = firstfree;
            firstfree = -idx - 1;

            if(first < 0)
               first = k;
         }
      }

      if(first >= 0)         // move remaining items
      {
         for(k = first, j = num(); k < j; ++k)
         {
            if(perm[k] >= 0)
            {
               thekey[perm[k]] = thekey[k];
               theitem[thekey[k].idx].info = perm[k];
               thekey[k].idx = -1;
            }
            else
               --thenum;
         }
      }
   }